

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  bool bVar1;
  bool bVar2;
  anon_class_8_1_c61d8849 fileSearch;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_c61d8849 local_128;
  anon_class_8_1_60cb577c local_120;
  string local_118 [32];
  undefined1 local_f8 [40];
  undefined1 local_d0 [168];
  
  memset(local_d0,0,0xa8);
  local_f8._0_8_ = local_d0;
  std::__cxx11::string::string((string *)(local_f8 + 8),(string *)name);
  local_120.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_f8;
  std::__cxx11::string::string(local_118,(string *)name);
  local_128.fileMatch = (anon_class_32_1_898f2789_for__M_pred *)local_118;
  bVar1 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                    (&local_128,&this->PostExcludeFilesStrict);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_120,&this->PostIncludeRegexes);
    if (!bVar1) {
      bVar1 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                        (&local_128,&this->PostIncludeFiles);
      if (!bVar1) {
        bVar1 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_120,&this->PostExcludeRegexes);
        if (!bVar1) {
          bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                            (&local_128,&this->PostExcludeFiles);
        }
        goto LAB_004365da;
      }
    }
    bVar2 = false;
  }
LAB_004365da:
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)(local_f8 + 8));
  return bVar2;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}